

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O2

int aq_add_adu(aq_t *q,adu_t *adu)

{
  dlist_head_t *head;
  void **ppvVar1;
  uint uVar2;
  dlist_t *pdVar3;
  void *__dest;
  void *pvVar4;
  dlist_s *pdVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  mp3_frame_t local_5e90;
  unsigned_long uVar14;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x27a,"int aq_add_adu(aq_t *, adu_t *)");
  }
  if (adu == (adu_t *)0x0) {
    __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x27b,"int aq_add_adu(aq_t *, adu_t *)");
  }
  aq_enqueue_adu(q,adu);
  pdVar3 = aq_tail_adu(q);
  if (pdVar3 == (dlist_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1df,
                  "void aq_insert_dummy_adus(aq_t *)");
  }
  pvVar6 = pdVar3->data;
  if (pvVar6 == (void *)0x0) {
    __assert_fail("tail != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e1,
                  "void aq_insert_dummy_adus(aq_t *)");
  }
  if (pdVar3->prev == (dlist_s *)0x0) {
    iVar11 = 0;
  }
  else {
    pvVar4 = pdVar3->prev->data;
    if (pvVar4 == (void *)0x0) {
      __assert_fail("prev != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e6,
                    "void aq_insert_dummy_adus(aq_t *)");
    }
    iVar11 = (*(int *)((long)pvVar4 + 0x4eb0) + *(int *)((long)pvVar4 + 0x10)) -
             *(int *)((long)pvVar4 + 0x4e80);
  }
  head = &q->adus;
  for (iVar7 = *(int *)((long)pvVar6 + 0x10) - iVar11; 0 < iVar7;
      iVar7 = iVar7 - *(int *)((long)pvVar6 + 0x4eb0)) {
    pdVar3 = aq_tail_adu(q);
    if (pdVar3 == (dlist_t *)0x0) {
      __assert_fail("dlist != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1bb,
                    "void aq_insert_dummy_adu(aq_t *, unsigned int)");
    }
    pvVar4 = pdVar3->data;
    if (pvVar4 == (void *)0x0) {
      __assert_fail("tail != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1bd,
                    "void aq_insert_dummy_adu(aq_t *, unsigned int)");
    }
    __dest = malloc(0x5e60);
    if (__dest == (void *)0x0) {
      __assert_fail("dummy != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1c0,
                    "void aq_insert_dummy_adu(aq_t *, unsigned int)");
    }
    memcpy(__dest,pvVar4,0x5e60);
    *(int *)((long)__dest + 0x10) = iVar11;
    pvVar4 = __dest;
    for (lVar9 = 0; lVar10 = 0x54, lVar9 != 2; lVar9 = lVar9 + 1) {
      for (; lVar10 != 0x2774; lVar10 = lVar10 + 0x1390) {
        *(undefined4 *)((long)pvVar4 + lVar10 + -0x28) = 0;
        *(undefined4 *)((long)pvVar4 + lVar10 + -0x34) = 0;
        *(undefined4 *)((long)pvVar4 + lVar10 + -0x20) = 0;
        *(undefined4 *)((long)pvVar4 + lVar10) = 0;
        *(undefined8 *)((long)pvVar4 + lVar10 + -8) = 0;
      }
      pvVar4 = (void *)((long)pvVar4 + 0x2728);
    }
    *(undefined8 *)((long)__dest + 0x4e78) = 0;
    *(undefined8 *)((long)__dest + 0x4e80) = 0;
    pdVar3 = dlist_ins_before(head,pdVar3,__dest);
    if (pdVar3 == (dlist_t *)0x0) {
      __assert_fail("new != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1d5,
                    "void aq_insert_dummy_adu(aq_t *, unsigned int)");
    }
    iVar11 = 0;
  }
  pdVar5 = aq_top_adu(q);
  if (pdVar5 == (dlist_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x255,
                  "int aq_need_adu(aq_t *)");
  }
  ppvVar1 = &pdVar5->data;
  if (*ppvVar1 == (void *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",599,
                  "int aq_need_adu(aq_t *)");
  }
  iVar11 = 0;
  while( true ) {
    if (pdVar5 == (dlist_t *)0x0) {
      return 0;
    }
    pvVar6 = pdVar5->data;
    if (pvVar6 == (void *)0x0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x262,
                    "int aq_need_adu(aq_t *)");
    }
    if (*(int *)((long)*ppvVar1 + 0x4eb0) <=
        (*(int *)((long)pvVar6 + 0x4e80) + iVar11) - *(int *)((long)pvVar6 + 0x10)) break;
    iVar11 = iVar11 + *(int *)((long)pvVar6 + 0x4eb0);
    pdVar5 = pdVar5->next;
  }
  pdVar5 = aq_top_adu(q);
  if (pdVar5 == (dlist_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x203,
                  "void aq_make_frame(aq_t *)");
  }
  if (pdVar5->data == (void *)0x0) {
    __assert_fail("top != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x205,"void aq_make_frame(aq_t *)");
  }
  memcpy(&local_5e90,pdVar5->data,0x4ec0);
  iVar11 = 0;
  memset(local_5e90.raw,0,4000);
  do {
    if (pdVar5 == (dlist_t *)0x0) {
      __assert_fail("dlist != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x213,
                    "void aq_make_frame(aq_t *)");
    }
    pvVar6 = pdVar5->data;
    if (pvVar6 == (void *)0x0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x215,
                    "void aq_make_frame(aq_t *)");
    }
    uVar2 = iVar11 - *(int *)((long)pvVar6 + 0x10);
    if ((long)local_5e90.frame_data_size < (long)(int)uVar2) break;
    uVar14 = *(ulong *)((long)pvVar6 + 0x4e80) + (long)(int)uVar2;
    if ((long)local_5e90.frame_data_size <= (long)uVar14) {
      uVar14 = local_5e90.frame_data_size;
    }
    uVar13 = (uint)uVar14;
    uVar8 = 0;
    if (0 < (int)uVar13) {
      uVar8 = uVar13;
    }
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = (ulong)uVar2;
    }
    if (-1 < (int)uVar2) {
      uVar8 = uVar13 - uVar2;
    }
    if (uVar8 != 0) {
      uVar2 = (int)uVar2 >> 0x1f & -uVar2;
      if (*(ulong *)((long)pvVar6 + 0x4e80) < (ulong)(uVar8 + uVar2)) {
        __assert_fail("adu->adu_size >= from_offset + data_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x237,
                      "void aq_make_frame(aq_t *)");
      }
      memcpy(local_5e90.raw +
             uVar12 + local_5e90.si_size + (ulong)(local_5e90.protected == '\0') * 2 + 4,
             (void *)((long)pvVar6 +
                     (ulong)uVar2 + 0x4ec4 +
                     *(long *)((long)pvVar6 + 0x4e68) +
                     (ulong)(*(char *)((long)pvVar6 + 2) == '\0') * 2),(ulong)uVar8);
    }
    iVar11 = iVar11 + *(int *)((long)pvVar6 + 0x4eb0);
    pdVar5 = pdVar5->next;
  } while ((long)(int)uVar13 < (long)local_5e90.frame_data_size);
  if (head->dlist == (dlist_t *)0x0) {
    __assert_fail("q->adus.dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xaa,
                  "void aq_discard_top_adu(aq_t *)");
  }
  pvVar6 = dlist_get(head,head->dlist);
  if (pvVar6 != (void *)0x0) {
    free(pvVar6);
    aq_enqueue_frame(q,&local_5e90);
    return 1;
  }
  __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                0xac,"void aq_discard_top_adu(aq_t *)");
}

Assistant:

int aq_add_adu(aq_t *q, adu_t *adu) {
  assert(q != NULL);
  assert(adu != NULL);

  aq_enqueue_adu(q, adu);
  aq_insert_dummy_adus(q);

  if (aq_need_adu(q)) {
    aq_make_frame(q);
    return 1;
  } else {
    return 0;
  }
}